

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyperGraph.h
# Opt level: O0

void __thiscall HyperGraph::build_one_RRset(HyperGraph *this,uint32_t uStart,size_t hyperIdx)

{
  uint uVar1;
  int iVar2;
  value_type vVar3;
  bool bVar4;
  reference pvVar5;
  reference pvVar6;
  const_reference pvVar7;
  size_type sVar8;
  size_t sVar9;
  const_reference pvVar10;
  allocator<unsigned_int> local_129;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_128;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_120;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_118;
  value_type local_110;
  reference local_f8;
  int local_e4;
  undefined1 auStack_e0 [4];
  int i;
  reference local_d0;
  uint local_bc;
  size_t sStack_b8;
  uint nbrId_1;
  size_t nextNbrIdx;
  double local_a0;
  double randDouble;
  uint local_84;
  reference ppStack_80;
  uint nbrId;
  pair<unsigned_int,_float> *nbr;
  const_iterator __end3;
  const_iterator __begin3;
  value_type *__range3;
  undefined1 auStack_58 [4];
  value_type expand;
  size_type local_48;
  size_t currIdx;
  size_t numVisitNode;
  size_t hyperIdx_local;
  HyperGraph *pHStack_28;
  uint32_t uStart_local;
  HyperGraph *this_local;
  double *psfmt64;
  double r;
  
  currIdx = 0;
  local_48 = 0;
  numVisitNode = hyperIdx;
  hyperIdx_local._4_4_ = uStart;
  pHStack_28 = this;
  pvVar5 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](&this->_FRsets,(ulong)uStart);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(pvVar5,&numVisitNode);
  vVar3 = hyperIdx_local._4_4_;
  sVar9 = currIdx;
  currIdx = currIdx + 1;
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&this->__vecVisitNode,sVar9);
  *pvVar6 = vVar3;
  _auStack_58 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          (&this->__vecVisitBool,(ulong)hyperIdx_local._4_4_);
  std::_Bit_reference::operator=((_Bit_reference *)auStack_58,true);
  while (sVar8 = local_48, local_48 < currIdx) {
    local_48 = local_48 + 1;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->__vecVisitNode,sVar8);
    uVar1 = *pvVar6;
    if (this->_cascadeModel == IC) {
      pvVar7 = std::
               vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
               ::operator[](this->_graph,(ulong)uVar1);
      __end3 = std::
               vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
               ::begin(pvVar7);
      nbr = (pair<unsigned_int,_float> *)
            std::
            vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
            ::end(pvVar7);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                                         *)&nbr), bVar4) {
        ppStack_80 = __gnu_cxx::
                     __normal_iterator<const_std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                     ::operator*(&__end3);
        local_84 = ppStack_80->first;
        _randDouble = std::vector<bool,_std::allocator<bool>_>::operator[]
                                (&this->__vecVisitBool,(ulong)local_84);
        bVar4 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&randDouble);
        if (!bVar4) {
          r = (double)&dsfmt_global_data;
          this_local = (HyperGraph *)&dsfmt_global_data;
          if (0x17d < dsfmt_global_data.idx) {
            dsfmt_gen_rand_all(&dsfmt_global_data);
            *(undefined4 *)((long)r + 0xc00) = 0;
          }
          sVar9 = currIdx;
          uVar1 = local_84;
          iVar2 = *(int *)((long)r + 0xc00);
          *(int *)((long)r + 0xc00) = iVar2 + 1;
          psfmt64 = *(double **)(&this_local->__numV + (long)iVar2 * 2);
          local_a0 = 2.0 - (double)psfmt64;
          if (local_a0 <= (double)ppStack_80->second) {
            currIdx = currIdx + 1;
            pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               (&this->__vecVisitNode,sVar9);
            *pvVar6 = uVar1;
            _nextNbrIdx = std::vector<bool,_std::allocator<bool>_>::operator[]
                                    (&this->__vecVisitBool,(ulong)local_84);
            std::_Bit_reference::operator=((_Bit_reference *)&nextNbrIdx,true);
            pvVar5 = std::
                     vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ::operator[](&this->_FRsets,(ulong)local_84);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      (pvVar5,&numVisitNode);
          }
        }
        __gnu_cxx::
        __normal_iterator<const_std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
        ::operator++(&__end3);
      }
    }
    else if (this->_cascadeModel == LT) {
      pvVar7 = std::
               vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
               ::operator[](this->_graph,(ulong)uVar1);
      sVar8 = std::
              vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
              ::size(pvVar7);
      if (sVar8 != 0) {
        pvVar7 = std::
                 vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                 ::operator[](this->_graph,(ulong)uVar1);
        sVar9 = gen_random_node_by_weight_LT(pvVar7);
        sStack_b8 = sVar9;
        pvVar7 = std::
                 vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                 ::operator[](this->_graph,(ulong)uVar1);
        sVar8 = std::
                vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                ::size(pvVar7);
        if (sVar8 <= sVar9) break;
        pvVar7 = std::
                 vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                 ::operator[](this->_graph,(ulong)uVar1);
        pvVar10 = std::
                  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                  ::operator[](pvVar7,sStack_b8);
        local_bc = pvVar10->first;
        local_d0 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (&this->__vecVisitBool,(ulong)local_bc);
        bVar4 = std::_Bit_reference::operator_cast_to_bool(&local_d0);
        sVar9 = currIdx;
        uVar1 = local_bc;
        if (bVar4) break;
        currIdx = currIdx + 1;
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&this->__vecVisitNode,sVar9);
        *pvVar6 = uVar1;
        _auStack_e0 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                (&this->__vecVisitBool,(ulong)local_bc);
        std::_Bit_reference::operator=((_Bit_reference *)auStack_e0,true);
        pvVar5 = std::
                 vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ::operator[](&this->_FRsets,(ulong)local_bc);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(pvVar5,&numVisitNode);
      }
    }
  }
  for (local_e4 = 0; (ulong)(long)local_e4 < currIdx; local_e4 = local_e4 + 1) {
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->__vecVisitNode,(long)local_e4);
    local_f8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         (&this->__vecVisitBool,(ulong)*pvVar6);
    std::_Bit_reference::operator=(&local_f8,false);
  }
  local_118._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         (&this->__vecVisitNode);
  local_128._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         (&this->__vecVisitNode);
  local_120 = __gnu_cxx::
              __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              ::operator+(&local_128,currIdx);
  std::allocator<unsigned_int>::allocator(&local_129);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::
  vector<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_110,local_118,local_120,
             &local_129);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back(&this->_RRsets,&local_110);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_110);
  std::allocator<unsigned_int>::~allocator(&local_129);
  return;
}

Assistant:

void build_one_RRset(const uint32_t uStart, const size_t hyperIdx)
    {
        size_t numVisitNode = 0, currIdx = 0;
        _FRsets[uStart].push_back(hyperIdx);
        __vecVisitNode[numVisitNode++] = uStart;
        __vecVisitBool[uStart] = true;
        while (currIdx < numVisitNode)
        {
            const auto expand = __vecVisitNode[currIdx++];
            if (_cascadeModel == IC)
            {
                for (auto& nbr : _graph[expand])
                {
                    const auto nbrId = nbr.first;
                    if (__vecVisitBool[nbrId])
                        continue;
                    const auto randDouble = dsfmt_gv_genrand_open_close();
                    if (randDouble > nbr.second)
                        continue;
                    __vecVisitNode[numVisitNode++] = nbrId;
                    __vecVisitBool[nbrId] = true;
                    _FRsets[nbrId].push_back(hyperIdx);
                }
            }
            else if (_cascadeModel == LT)
            {
                if (_graph[expand].size() == 0)
                    continue;
                const auto nextNbrIdx = gen_random_node_by_weight_LT(_graph[expand]);
                if (nextNbrIdx >= _graph[expand].size()) break; // No element activated
                const auto nbrId = _graph[expand][nextNbrIdx].first;
                if (__vecVisitBool[nbrId]) break; // Stop, no further node activated
                __vecVisitNode[numVisitNode++] = nbrId;
                __vecVisitBool[nbrId] = true;
                _FRsets[nbrId].push_back(hyperIdx);
            }
        }
        for (int i = 0; i < numVisitNode; i++) __vecVisitBool[__vecVisitNode[i]] = false;
        _RRsets.push_back(RRset(__vecVisitNode.begin(), __vecVisitNode.begin() + numVisitNode));
    }